

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::shouldResolveCycle
          (CAPIBuildSystemFrontendDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items,
          Rule *candidateRule,CycleAction action)

{
  uint8_t uVar1;
  CAPIBuildKey *this_00;
  bool bVar2;
  CAPIRulesVector rules;
  BuildKey key;
  CAPIRulesVector local_58;
  BuildKey local_40;
  
  if ((this->cAPIDelegate).should_resolve_cycle ==
      (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
       *)0x0) {
    bVar2 = false;
  }
  else {
    CAPIRulesVector::CAPIRulesVector(&local_58,items);
    llbuild::buildsystem::BuildKey::fromData(&local_40,&candidateRule->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,&local_40);
    if (SupplyPriorValue < action) {
      __assert_fail("0 && \"unknown cycle action\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x213,
                    "static llb_cycle_action_t (anonymous namespace)::CAPIBuildSystemFrontendDelegate::convertCycleAction(core::Rule::CycleAction)"
                   );
    }
    uVar1 = (*(this->cAPIDelegate).should_resolve_cycle)
                      ((this->cAPIDelegate).context,
                       (llb_build_key_t **)
                       local_58.rules.
                       super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)local_58.rules.
                             super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.rules.
                             super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3,
                       (llb_build_key_t *)this_00,action);
    llb_build_key_destroy((llb_build_key_t *)this_00);
    bVar2 = uVar1 != '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.key.key._M_dataplus._M_p != &local_40.key.key.field_2) {
      operator_delete(local_40.key.key._M_dataplus._M_p,
                      local_40.key.key.field_2._M_allocated_capacity + 1);
    }
    CAPIRulesVector::~CAPIRulesVector(&local_58);
  }
  return bVar2;
}

Assistant:

virtual bool shouldResolveCycle(const std::vector<core::Rule*>& items,
                                  core::Rule* candidateRule,
                                  core::Rule::CycleAction action) override {
    if (!cAPIDelegate.should_resolve_cycle)
      return false;

    CAPIRulesVector rules(items);
    auto key = BuildKey::fromData(candidateRule->key);
    auto candidate = (llb_build_key_t *)new CAPIBuildKey(key);

    uint8_t result = cAPIDelegate.should_resolve_cycle(cAPIDelegate.context,
                                                       rules.data(),
                                                       rules.count(),
                                                       candidate,
                                                       convertCycleAction(action));

    llb_build_key_destroy(candidate);

    return (result);
  }